

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curltest.c
# Opt level: O0

int main(int argc,char **argv)

{
  int local_1c;
  int retVal;
  char **argv_local;
  int argc_local;
  
  curl_global_init(3);
  if (argc < 2) {
    printf("error: first argument should be a url to download\n");
    local_1c = 1;
  }
  else {
    local_1c = GetWebFiles(argv[1],(char *)0x0);
  }
  curl_global_cleanup();
  return local_1c;
}

Assistant:

int main(int argc, char **argv)
{
  int retVal = 0;

  curl_global_init(CURL_GLOBAL_DEFAULT);

  if(argc>1)
    {
    retVal += GetWebFiles(argv[1], 0);
    }
  else
    {
    printf("error: first argument should be a url to download\n");
    retVal = 1;
    }

  /* Do not check the output of FTP socks5 cannot handle FTP yet */
  /* GetFtpFile(); */
  /* do not test ftp right now because we don't enable that port */

  curl_global_cleanup();

  return retVal;
}